

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O0

LongNameHandler *
icu_63::number::impl::LongNameHandler::forCurrencyLongNames
          (Locale *loc,CurrencyUnit *currency,PluralRules *rules,MicroPropsGenerator *parent,
          UErrorCode *status)

{
  UBool UVar1;
  LongNameHandler *this;
  UnicodeString *local_2c0;
  UnicodeString *local_278;
  LongNameHandler *local_268;
  UnicodeString local_258 [8];
  undefined1 auStack_58 [32];
  LongNameHandler *result;
  UErrorCode *status_local;
  MicroPropsGenerator *parent_local;
  PluralRules *rules_local;
  CurrencyUnit *currency_local;
  Locale *loc_local;
  
  result = (LongNameHandler *)status;
  status_local = (UErrorCode *)parent;
  parent_local = (MicroPropsGenerator *)rules;
  rules_local = (PluralRules *)currency;
  currency_local = (CurrencyUnit *)loc;
  this = (LongNameHandler *)UMemory::operator_new((UMemory *)0x2c0,(size_t)currency);
  auStack_58[0x17] = 0;
  local_268 = (LongNameHandler *)0x0;
  if (this != (LongNameHandler *)0x0) {
    auStack_58[0x17] = 1;
    LongNameHandler(this,(PluralRules *)parent_local,(MicroPropsGenerator *)status_local);
    local_268 = this;
  }
  auStack_58._24_8_ = local_268;
  if (local_268 == (LongNameHandler *)0x0) {
    *(undefined4 *)&(result->super_MicroPropsGenerator)._vptr_MicroPropsGenerator = 7;
    loc_local = (Locale *)0x0;
  }
  else {
    local_278 = local_258;
    do {
      UnicodeString::UnicodeString(local_278);
      local_278 = local_278 + 1;
    } while (local_278 != (UnicodeString *)auStack_58);
    anon_unknown.dwarf_13ccb4::getCurrencyLongNameData
              ((Locale *)currency_local,(CurrencyUnit *)rules_local,local_258,(UErrorCode *)result);
    UVar1 = ::U_FAILURE(*(UErrorCode *)
                         &(result->super_MicroPropsGenerator)._vptr_MicroPropsGenerator);
    if (UVar1 == '\0') {
      simpleFormatsToModifiers
                ((LongNameHandler *)auStack_58._24_8_,local_258,UNUM_CURRENCY_FIELD,
                 (UErrorCode *)result);
      loc_local = (Locale *)auStack_58._24_8_;
    }
    else {
      loc_local = (Locale *)0x0;
    }
    local_2c0 = (UnicodeString *)auStack_58;
    do {
      local_2c0 = local_2c0 + -1;
      UnicodeString::~UnicodeString(local_2c0);
    } while (local_2c0 != local_258);
  }
  return (LongNameHandler *)loc_local;
}

Assistant:

LongNameHandler* LongNameHandler::forCurrencyLongNames(const Locale &loc, const CurrencyUnit &currency,
                                                      const PluralRules *rules,
                                                      const MicroPropsGenerator *parent,
                                                      UErrorCode &status) {
    auto* result = new LongNameHandler(rules, parent);
    if (result == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }
    UnicodeString simpleFormats[ARRAY_LENGTH];
    getCurrencyLongNameData(loc, currency, simpleFormats, status);
    if (U_FAILURE(status)) { return nullptr; }
    result->simpleFormatsToModifiers(simpleFormats, UNUM_CURRENCY_FIELD, status);
    return result;
}